

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t __thiscall
andres::
BinaryViewExpression<andres::BinaryViewExpression<andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Times<float,_float,_float>_>,_float,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Times<float,_float,_float>_>
::shape(BinaryViewExpression<andres::BinaryViewExpression<andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Times<float,_float,_float>_>,_float,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Times<float,_float,_float>_>
        *this,size_t j)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = BinaryViewExpression<andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Times<float,_float,_float>_>
          ::dimension(this->e1_);
  sVar2 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(this->e2_);
  if (sVar1 < sVar2) {
    sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::shape(this->e2_,j);
    return sVar1;
  }
  sVar1 = BinaryViewExpression<andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Times<float,_float,_float>_>
          ::shape(this->e1_,j);
  return sVar1;
}

Assistant:

const std::size_t shape(const std::size_t j) const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shape(j) : e1_.shape(j); }